

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O3

void fe::operations::applyOperationT<fe::operations::op_blit_colored,fe::PixelA8,fe::PixelB8G8R8A8>
               (op_blit_colored *op,PixelA8 *srcPixelFormat,PixelB8G8R8A8 *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  uint8_t *puVar7;
  byte *pbVar8;
  int iVar9;
  uint8_t *puVar10;
  byte *pbVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar22 [16];
  
  bVar6 = check(src,dest);
  auVar5 = _DAT_00116220;
  if ((bVar6) && (iVar1 = (dest->super_fe_image).h, iVar1 != 0)) {
    iVar2 = (dest->super_fe_image).w;
    puVar10 = (dest->super_fe_image).data;
    pbVar11 = (src->super_fe_image).data;
    iVar9 = 0;
    iVar4 = iVar2;
    pbVar8 = pbVar11;
    puVar7 = puVar10;
    do {
      for (; iVar4 != 0; iVar4 = iVar4 + -1) {
        uVar3 = *(undefined4 *)(op->color).field_0.field_0.bytes;
        auVar14._8_8_ = 0;
        auVar14._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar3 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar3 >> 0x10),uVar3)) >>
                                                  0x20),uVar3) >> 0x18),
                                             CONCAT12((char)((uint)uVar3 >> 8),(short)uVar3)) >>
                                   0x10),(short)uVar3) & 0xffff00ff00ff00ff;
        auVar22 = pshuflw(ZEXT116(*pbVar11),ZEXT116(*pbVar11),0);
        auVar14 = pshuflw(auVar14,auVar14,0xc6);
        auVar15._0_2_ = auVar14._0_2_ * auVar22._0_2_;
        auVar15._2_2_ = auVar14._2_2_ * auVar22._2_2_;
        auVar15._4_2_ = auVar14._4_2_ * auVar22._4_2_;
        auVar15._6_2_ = auVar14._6_2_ * auVar22._6_2_;
        auVar15._8_2_ = auVar14._8_2_ * auVar22._8_2_;
        auVar15._10_2_ = auVar14._10_2_ * auVar22._10_2_;
        auVar15._12_2_ = auVar14._12_2_ * auVar22._12_2_;
        auVar15._14_2_ = auVar14._14_2_ * auVar22._14_2_;
        auVar14 = pmulhuw(auVar15,auVar5);
        uVar12 = auVar14._0_2_ >> 7;
        uVar16 = auVar14._2_2_ >> 7;
        uVar18 = auVar14._4_2_ >> 7;
        uVar20 = auVar14._6_2_ >> 7;
        uVar13 = uVar12 & 0xff;
        uVar17 = uVar16 & 0xff;
        uVar19 = uVar18 & 0xff;
        uVar21 = uVar20 & 0xff;
        *(uint *)puVar10 =
             CONCAT13((uVar21 != 0) * (uVar21 < 0x100) * (char)uVar20 - (0xff < uVar21),
                      CONCAT12((uVar19 != 0) * (uVar19 < 0x100) * (char)uVar18 - (0xff < uVar19),
                               CONCAT11((uVar17 != 0) * (uVar17 < 0x100) * (char)uVar16 -
                                        (0xff < uVar17),
                                        (uVar13 != 0) * (uVar13 < 0x100) * (char)uVar12 -
                                        (0xff < uVar13))));
        puVar10 = puVar10 + (dest->super_fe_image).bytespp;
        pbVar11 = pbVar11 + (src->super_fe_image).bytespp;
      }
      pbVar11 = pbVar8 + (src->super_fe_image).pitch;
      puVar10 = puVar7 + (dest->super_fe_image).pitch;
      iVar9 = iVar9 + 1;
      iVar4 = iVar2;
      pbVar8 = pbVar11;
      puVar7 = puVar10;
    } while (iVar9 != iVar1);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }